

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frm_driver.c
# Opt level: O2

int Synchronize_Linked_Fields(FIELD *field)

{
  int iVar1;
  int iVar2;
  int iVar3;
  fieldnode *field_00;
  
  if (field == (FIELD *)0x0) {
    iVar3 = -2;
  }
  else {
    field_00 = field->link;
    if (field_00 == (fieldnode *)0x0) {
      iVar3 = -1;
    }
    else {
      iVar3 = 0;
      for (; field_00 != field; field_00 = field_00->link) {
        iVar1 = Synchronize_Field(field_00);
        iVar2 = iVar3;
        if (iVar3 == 0) {
          iVar2 = iVar1;
        }
        if (iVar1 != 0) {
          iVar3 = iVar2;
        }
      }
    }
  }
  return iVar3;
}

Assistant:

static int Synchronize_Linked_Fields(FIELD * field)
{
  FIELD *linked_field;
  int res = E_OK;
  int syncres;

  if (!field)
    return(E_BAD_ARGUMENT);

  if (!field->link)
    return(E_SYSTEM_ERROR);

  for(linked_field = field->link; 
      linked_field!= field;
      linked_field = linked_field->link )
    {
      if (((syncres=Synchronize_Field(linked_field)) != E_OK) &&
          (res==E_OK))
        res = syncres;
    }
  return(res);
}